

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows_h.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  string *psVar1;
  long lVar2;
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  CompletionFlag completion;
  HelpFlag help;
  ArgumentParser parser;
  undefined1 local_808 [8];
  _Alloc_hider local_800;
  char local_7f8 [8];
  char local_7f0 [16];
  string local_7e0;
  undefined1 local_7c0 [40];
  undefined2 local_798;
  size_type *local_790;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_788;
  undefined1 local_750 [336];
  FlagBase local_600;
  ArgumentParser local_4f0;
  
  local_750._0_8_ = local_750 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"This is a test program.","");
  psVar1 = &local_600.super_NamedBase.super_Base.help;
  local_600.super_NamedBase.super_Base._vptr_Base = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_600,"This goes after the options.","");
  args::ArgumentParser::ArgumentParser(&local_4f0,(string *)local_750,(string *)&local_600);
  if ((string *)local_600.super_NamedBase.super_Base._vptr_Base != psVar1) {
    operator_delete(local_600.super_NamedBase.super_Base._vptr_Base);
  }
  if ((undefined1 *)local_750._0_8_ != local_750 + 0x10) {
    operator_delete((void *)local_750._0_8_);
  }
  local_808 = (undefined1  [8])local_7f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_808,"help","");
  local_7e0._M_dataplus._M_p = (pointer)&local_7e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7e0,"Display this help menu","");
  local_7c0._8_8_ = local_7c0 + 0x18;
  local_7c0[0] = true;
  local_7c0[1] = 'h';
  local_7c0._16_8_ = (_Hash_node_base *)0x0;
  local_7c0[0x18] = '\0';
  local_798 = 0;
  local_790 = &local_788._M_bucket_count;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"help","");
  in._M_len = 2;
  in._M_array = (iterator)local_7c0;
  args::Matcher::Matcher((Matcher *)local_750,in);
  args::Flag::Flag((Flag *)&local_600,(Group *)&local_4f0,(string *)local_808,&local_7e0,
                   (Matcher *)local_750,None);
  local_600.super_NamedBase.super_Base._vptr_Base = (_func_int **)&PTR__FlagBase_0011b7e0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)(local_750 + 0x38));
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_750);
  lVar2 = 0;
  do {
    if (local_750 + lVar2 + -0x30 != *(undefined1 **)((long)&local_790 + lVar2)) {
      operator_delete(*(undefined1 **)((long)&local_790 + lVar2));
    }
    lVar2 = lVar2 + -0x28;
  } while (lVar2 != -0x50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e0._M_dataplus._M_p != &local_7e0.field_2) {
    operator_delete(local_7e0._M_dataplus._M_p);
  }
  if (local_808 != (undefined1  [8])local_7f8) {
    operator_delete((void *)local_808);
  }
  local_808 = (undefined1  [8])((ulong)local_808 & 0xffffffffffff0000);
  local_800._M_p = local_7f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_800,"complete","");
  in_00._M_len = 1;
  in_00._M_array = (iterator)local_808;
  args::Matcher::Matcher((Matcher *)local_7c0,in_00);
  args::CompletionFlag::CompletionFlag<args::ArgumentParser>
            ((CompletionFlag *)local_750,&local_4f0,(Matcher *)local_7c0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_788);
  std::
  _Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<char,_char,_std::allocator<char>,_std::__detail::_Identity,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_7c0);
  if (local_800._M_p != local_7f0) {
    operator_delete(local_800._M_p);
  }
  args::ArgumentParser::ParseCLI(&local_4f0,argc,argv);
  args::CompletionFlag::~CompletionFlag((CompletionFlag *)local_750);
  args::FlagBase::~FlagBase(&local_600);
  local_4f0.super_Command.super_Group.super_Base._vptr_Base =
       (_func_int **)&PTR__ArgumentParser_0011b400;
  args::HelpParams::~HelpParams(&local_4f0.helpParams);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0.terminator._M_dataplus._M_p != &local_4f0.terminator.field_2) {
    operator_delete(local_4f0.terminator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0.longseparator._M_dataplus._M_p != &local_4f0.longseparator.field_2) {
    operator_delete(local_4f0.longseparator._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0.shortprefix._M_dataplus._M_p != &local_4f0.shortprefix.field_2) {
    operator_delete(local_4f0.shortprefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0.longprefix._M_dataplus._M_p != &local_4f0.longprefix.field_2) {
    operator_delete(local_4f0.longprefix._M_dataplus._M_p);
  }
  args::Command::~Command(&local_4f0.super_Command);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    args::ArgumentParser parser("This is a test program.", "This goes after the options.");
    args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
    args::CompletionFlag completion(parser, {"complete"});
    try
    {
        parser.ParseCLI(argc, argv);
    }
    catch (args::Completion& e)
    {
        std::cout << e.what();
        return 0;
    }
    catch (args::Help&)
    {
        std::cout << parser;
        return 0;
    }
    catch (args::ParseError& e)
    {
        std::cerr << e.what() << std::endl;
        std::cerr << parser;
        return 1;
    }
    return 0;
}